

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::Element::ParseElement
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               Element *pOut)

{
  char *__end;
  bool bVar1;
  EElementSemantic EVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  reference __s;
  size_t sVar6;
  int local_cc;
  undefined1 local_c8 [8];
  Property prop;
  char *pCur;
  string local_88 [32];
  char *local_68;
  char *endPos;
  allocator<char> local_49;
  string local_48 [32];
  Element *local_28;
  Element *pOut_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  
  local_28 = pOut;
  pOut_local = (Element *)buffer;
  buffer_local = (vector<char,_std::allocator<char>_> *)streamBuffer;
  if (pOut != (Element *)0x0) {
    bVar1 = DOM::SkipSpaces(buffer);
    if (bVar1) {
      bVar1 = DOM::TokenMatch((vector<char,_std::allocator<char>_> *)pOut_local,"element",7);
      if ((bVar1) ||
         (bVar1 = DOM::TokenMatch((vector<char,_std::allocator<char>_> *)pOut_local,"comment",7),
         bVar1)) {
        bVar1 = DOM::SkipSpaces((vector<char,_std::allocator<char>_> *)pOut_local);
        if (bVar1) {
          EVar2 = ParseSemantic((vector<char,_std::allocator<char>_> *)pOut_local);
          local_28->eSemantic = EVar2;
          if (local_28->eSemantic == EEST_INVALID) {
            pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)pOut_local,0);
            pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)pOut_local,0);
            __s = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)pOut_local,0);
            sVar6 = strlen(__s);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<char*,void>(local_48,pvVar4,pvVar5 + sVar6,&local_49);
            std::__cxx11::string::operator=((string *)&local_28->szName,local_48);
            std::__cxx11::string::~string(local_48);
            std::allocator<char>::~allocator(&local_49);
          }
          bVar1 = DOM::SkipSpaces((vector<char,_std::allocator<char>_> *)pOut_local);
          if (bVar1) {
            if (local_28->eSemantic == EEST_TextureFile) {
              pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)pOut_local,0);
              pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)pOut_local,0);
              sVar6 = strlen(pvVar5);
              local_68 = pvVar4 + (sVar6 - 1);
              pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)pOut_local,0);
              __end = local_68;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<char*,void>
                        (local_88,pvVar4,__end,(allocator<char> *)((long)&pCur + 7));
              std::__cxx11::string::operator=((string *)&local_28->szName,local_88);
              std::__cxx11::string::~string(local_88);
              std::allocator<char>::~allocator((allocator<char> *)((long)&pCur + 7));
              DOM::SkipSpacesAndLineEnd((vector<char,_std::allocator<char>_> *)pOut_local);
              streamBuffer_local._7_1_ = true;
            }
            else {
              prop._40_8_ = std::vector<char,_std::allocator<char>_>::operator[]
                                      ((vector<char,_std::allocator<char>_> *)pOut_local,0);
              uVar3 = strtoul10((char *)prop._40_8_,(char **)&prop.bIsList);
              local_28->NumOccur = uVar3;
              DOM::SkipSpacesAndLineEnd((vector<char,_std::allocator<char>_> *)pOut_local);
              do {
                IOStreamBuffer<char>::getNextLine
                          ((IOStreamBuffer<char> *)buffer_local,
                           (vector<char,_std::allocator<char>_> *)pOut_local);
                prop._40_8_ = std::vector<char,_std::allocator<char>_>::operator[]
                                        ((vector<char,_std::allocator<char>_> *)pOut_local,0);
                DOM::SkipComments((vector<char,_std::allocator<char>_> *)pOut_local);
                Property::Property((Property *)local_c8);
                bVar1 = Property::ParseProperty
                                  ((vector<char,_std::allocator<char>_> *)pOut_local,
                                   (Property *)local_c8);
                if (bVar1) {
                  std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::
                  push_back(&local_28->alProperties,(value_type *)local_c8);
                  local_cc = 0;
                }
                else {
                  local_cc = 3;
                }
                Property::~Property((Property *)local_c8);
              } while (local_cc == 0);
              streamBuffer_local._7_1_ = true;
            }
          }
          else {
            streamBuffer_local._7_1_ = false;
          }
        }
        else {
          streamBuffer_local._7_1_ = false;
        }
      }
      else {
        streamBuffer_local._7_1_ = false;
      }
    }
    else {
      streamBuffer_local._7_1_ = false;
    }
    return streamBuffer_local._7_1_;
  }
  __assert_fail("__null != pOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                ,0x15e,
                "static bool Assimp::PLY::Element::ParseElement(IOStreamBuffer<char> &, std::vector<char> &, PLY::Element *)"
               );
}

Assistant:

bool PLY::Element::ParseElement(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer, PLY::Element* pOut)
{
  ai_assert(NULL != pOut);
  // Example format: "element vertex 8"

  // skip leading spaces
  if (!PLY::DOM::SkipSpaces(buffer))
  {
    return false;
  }

  // skip the "element" string at the beginning
  if (!PLY::DOM::TokenMatch(buffer, "element", 7) && !PLY::DOM::TokenMatch(buffer, "comment", 7))
  {
    // seems not to be a valid property entry
    return false;
  }
  // get next word
  if (!PLY::DOM::SkipSpaces(buffer))
    return false;

  // parse the semantic of the element
  pOut->eSemantic = PLY::Element::ParseSemantic(buffer);
  if (PLY::EEST_INVALID == pOut->eSemantic)
  {
    // if the exact semantic can't be determined, just store
    // the original string identifier
    pOut->szName = std::string(&buffer[0], &buffer[0] + strlen(&buffer[0]));
  }

  if (!PLY::DOM::SkipSpaces(buffer))
    return false;

  if (PLY::EEST_TextureFile == pOut->eSemantic)
  {
    char* endPos = &buffer[0] + (strlen(&buffer[0]) - 1);
    pOut->szName = std::string(&buffer[0], endPos);

    // go to the next line
    PLY::DOM::SkipSpacesAndLineEnd(buffer);

    return true;
  }

  //parse the number of occurrences of this element
  const char* pCur = (char*)&buffer[0];
  pOut->NumOccur = strtoul10(pCur, &pCur);

  // go to the next line
  PLY::DOM::SkipSpacesAndLineEnd(buffer);

  // now parse all properties of the element
  while (true)
  {
    streamBuffer.getNextLine(buffer);
    pCur = (char*)&buffer[0];

    // skip all comments
    PLY::DOM::SkipComments(buffer);

    PLY::Property prop;
    if (!PLY::Property::ParseProperty(buffer, &prop))
      break;

    pOut->alProperties.push_back(prop);
  }

  return true;
}